

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_encode.c
# Opt level: O2

int cram_put_bam_seq(cram_fd *fd,bam_seq_t *b)

{
  int iVar1;
  uint uVar2;
  spare_bams *__ptr;
  bool bVar3;
  int iVar4;
  int iVar5;
  cram_container *c;
  cram_slice *pcVar6;
  int *piVar7;
  bam_seq_t **ppbVar8;
  bam1_t *pbVar9;
  int iVar10;
  int iVar11;
  cram_block_slice_hdr *pcVar12;
  int iVar13;
  int32_t iVar14;
  bam_seq_t *pbVar15;
  long lVar16;
  
  c = fd->ctr;
  if (c == (cram_container *)0x0) {
    c = cram_new_container(fd->seqs_per_slice,fd->slices_per_container);
    fd->ctr = c;
    if (c == (cram_container *)0x0) {
      return -1;
    }
    c->record_counter = fd->record_counter;
  }
  if (((c->slice != (cram_slice *)0x0) && (c->curr_rec != c->max_rec)) &&
     (c->curr_ref < -1 || (b->core).tid == c->curr_ref)) goto LAB_00121e2e;
  pbVar15 = (bam_seq_t *)&c->curr_ref;
  if (c->slice == (cram_slice *)0x0) {
    pbVar15 = b;
  }
  iVar11 = (pbVar15->core).tid;
  bVar3 = fd->multi_seq == 1;
  if (fd->multi_seq == -1) {
    iVar4 = c->max_rec / 4 + 10;
    if (c->curr_rec < iVar4) {
      bVar3 = false;
      if ((fd->last_slice != 0) && (bVar3 = false, fd->last_slice < iVar4)) {
        if (fd->embed_ref != 0) goto LAB_001219fb;
        bVar3 = true;
        if ((fd->verbose != 0) && (c->multi_seq == 0)) {
          fwrite("Multi-ref enabled for this container\n",0x25,1,_stderr);
          bVar3 = true;
        }
      }
    }
    else {
LAB_001219fb:
      bVar3 = false;
    }
  }
  iVar4 = c->curr_rec;
  iVar1 = c->slice_rec;
  if (((((fd->version & 0xffffff00U) == 0x100) || (iVar4 == c->max_rec)) || (fd->multi_seq != 1)) ||
     (iVar5 = iVar4, c->slice == (cram_slice *)0x0)) {
    c = fd->ctr;
    iVar5 = c->curr_ref;
    if (iVar5 == -2) {
      iVar5 = (b->core).tid;
      c->curr_ref = iVar5;
    }
    if (c->slice == (cram_slice *)0x0) {
      iVar10 = c->curr_slice;
    }
    else {
      pcVar12 = c->slice->hdr;
      if (c->multi_seq == 0) {
        iVar10 = c->first_base;
        iVar14 = (c->last_base - iVar10) + 1;
        iVar13 = iVar5;
      }
      else {
        iVar10 = 0;
        iVar14 = 0;
        iVar13 = -2;
      }
      pcVar12->ref_seq_id = iVar13;
      pcVar12->ref_seq_start = iVar10;
      pcVar12->ref_seq_span = iVar14;
      pcVar12->num_records = c->curr_rec;
      if (c->curr_slice == 0) {
        if (c->ref_seq_id != iVar13) {
          c->ref_seq_id = iVar13;
        }
        c->ref_seq_start = c->first_base;
      }
      iVar10 = c->curr_slice + 1;
      c->curr_slice = iVar10;
    }
    if ((iVar10 == c->max_slice) || (((b->core).tid != iVar5 && (c->multi_seq == 0)))) {
      c->ref_seq_span = (fd->last_base - c->ref_seq_start) + 1;
      if (fd->verbose != 0) {
        fprintf(_stderr,"Flush container %d/%d..%d\n",(ulong)(uint)c->ref_seq_id);
      }
      if (fd->pool == (t_pool *)0x0) {
        iVar5 = cram_flush_container(fd,c);
        if (iVar5 == -1) goto LAB_00121bfa;
        for (lVar16 = 0; lVar16 < c->max_slice; lVar16 = lVar16 + 1) {
          cram_free_slice(c->slices[lVar16]);
          c->slices[lVar16] = (cram_slice *)0x0;
        }
        c->slice = (cram_slice *)0x0;
        c->curr_slice = 0;
        cram_free_container(c);
      }
      else {
        iVar5 = cram_flush_container_mt(fd,c);
        if (iVar5 == -1) goto LAB_00121bfa;
      }
      c = cram_new_container(fd->seqs_per_slice,fd->slices_per_container);
      fd->ctr = c;
      if (c == (cram_container *)0x0) {
        return -1;
      }
      c->record_counter = fd->record_counter;
      c->curr_ref = (b->core).tid;
    }
    iVar5 = (b->core).pos + 1;
    c->last_base = iVar5;
    c->first_base = iVar5;
    c->last_pos = iVar5;
    pcVar6 = cram_new_slice(MAPPED_SLICE,c->max_rec);
    c->slices[c->curr_slice] = pcVar6;
    c->slice = pcVar6;
    if (pcVar6 == (cram_slice *)0x0) {
LAB_00121bfa:
      if (fd->ctr != (cram_container *)0x0) {
        cram_free_container(fd->ctr);
        fd->ctr = (cram_container *)0x0;
        return -1;
      }
      return -1;
    }
    if (c->multi_seq == 0) {
      pcVar12 = pcVar6->hdr;
      pcVar12->ref_seq_id = (b->core).tid;
      iVar14 = (b->core).pos + 1;
      iVar5 = iVar14;
    }
    else {
      pcVar12 = pcVar6->hdr;
      pcVar12->ref_seq_id = -2;
      iVar14 = 0;
      iVar5 = 1;
    }
    pcVar12->ref_seq_start = iVar14;
    pcVar6->last_apos = iVar5;
    c->curr_rec = 0;
    iVar5 = 0;
  }
  if (bVar3) {
    fd->multi_seq = 1;
    c->multi_seq = 1;
    c->pos_sorted = 0;
    if (c->refs_used == (int *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)&fd->ref_lock);
      piVar7 = (int *)calloc((long)fd->refs->nref,4);
      c->refs_used = piVar7;
      pthread_mutex_unlock((pthread_mutex_t *)&fd->ref_lock);
      if (c->refs_used == (int *)0x0) {
        return -1;
      }
      iVar5 = c->curr_rec;
    }
  }
  fd->last_slice = iVar4 - iVar1;
  c->slice_rec = iVar5;
  iVar4 = (b->core).tid;
  if (((-1 < (long)iVar4) && (iVar4 != iVar11)) &&
     ((fd->embed_ref == 0 && (!(bool)(bVar3 ^ 1U | fd->unsorted != 0))))) {
    if (c->refs_used == (int *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)&fd->ref_lock);
      piVar7 = (int *)calloc((long)fd->refs->nref,4);
      c->refs_used = piVar7;
      pthread_mutex_unlock((pthread_mutex_t *)&fd->ref_lock);
      if (c->refs_used == (int *)0x0) {
        return -1;
      }
    }
    else if (c->refs_used[iVar4] != 0) {
      fwrite("Unsorted mode enabled\n",0x16,1,_stderr);
      pthread_mutex_lock((pthread_mutex_t *)&fd->ref_lock);
      fd->unsorted = 1;
      pthread_mutex_unlock((pthread_mutex_t *)&fd->ref_lock);
      fd->multi_seq = 1;
    }
  }
  uVar2 = (b->core).tid;
  c->curr_ref = uVar2;
  if (-1 < (int)uVar2 && c->refs_used != (int *)0x0) {
    piVar7 = c->refs_used + uVar2;
    *piVar7 = *piVar7 + 1;
  }
LAB_00121e2e:
  ppbVar8 = c->bams;
  if (ppbVar8 == (bam_seq_t **)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&fd->bam_list_lock);
    __ptr = fd->bl;
    if (__ptr == (spare_bams *)0x0) {
      ppbVar8 = (bam_seq_t **)calloc((long)c->max_c_rec,8);
      c->bams = ppbVar8;
      if (ppbVar8 == (bam_seq_t **)0x0) {
        return -1;
      }
    }
    else {
      c->bams = __ptr->bams;
      fd->bl = __ptr->next;
      free(__ptr);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&fd->bam_list_lock);
    ppbVar8 = c->bams;
  }
  if (ppbVar8[c->curr_c_rec] == (bam1_t *)0x0) {
    pbVar9 = bam_init1();
    pbVar9 = bam_copy1(pbVar9,b);
    iVar11 = c->curr_c_rec;
    c->bams[iVar11] = pbVar9;
  }
  else {
    bam_copy1(ppbVar8[c->curr_c_rec],b);
    iVar11 = c->curr_c_rec;
  }
  c->curr_rec = c->curr_rec + 1;
  c->curr_c_rec = iVar11 + 1;
  fd->record_counter = fd->record_counter + 1;
  return 0;
}

Assistant:

int cram_put_bam_seq(cram_fd *fd, bam_seq_t *b) {
    cram_container *c;

    if (!fd->ctr) {
	fd->ctr = cram_new_container(fd->seqs_per_slice,
				     fd->slices_per_container);
	if (!fd->ctr)
	    return -1;
	fd->ctr->record_counter = fd->record_counter;
    }
    c = fd->ctr;

    if (!c->slice || c->curr_rec == c->max_rec ||
	(bam_ref(b) != c->curr_ref && c->curr_ref >= -1)) {
	int slice_rec, curr_rec, multi_seq = fd->multi_seq == 1;
	int curr_ref = c->slice ? c->curr_ref : bam_ref(b);


	/*
	 * Start packing slices when we routinely have under 1/4tr full.
	 *
	 * This option isn't available if we choose to embed references
	 * since we can only have one per slice.
	 */
	if (fd->multi_seq == -1 && c->curr_rec < c->max_rec/4+10 &&
	    fd->last_slice && fd->last_slice < c->max_rec/4+10 &&
	    !fd->embed_ref) {
	    if (fd->verbose && !c->multi_seq)
		fprintf(stderr, "Multi-ref enabled for this container\n");
	    multi_seq = 1;
	}

	slice_rec = c->slice_rec;
	curr_rec  = c->curr_rec;

	if (CRAM_MAJOR_VERS(fd->version) == 1 ||
	    c->curr_rec == c->max_rec || fd->multi_seq != 1 || !c->slice) {
	    if (NULL == (c = cram_next_container(fd, b))) {
		if (fd->ctr) {
		    // prevent cram_close attempting to flush
		    cram_free_container(fd->ctr);
		    fd->ctr = NULL;
		}
		return -1;
	    }
	}

	/*
	 * Due to our processing order, some things we've already done we
	 * cannot easily undo. So when we first notice we should be packing
	 * multiple sequences per container we emit the small partial
	 * container as-is and then start a fresh one in a different mode.
	 */
	if (multi_seq) {
	    fd->multi_seq = 1;
	    c->multi_seq = 1;
	    c->pos_sorted = 0; // required atm for multi_seq slices

	    if (!c->refs_used) {
		pthread_mutex_lock(&fd->ref_lock);
		c->refs_used = calloc(fd->refs->nref, sizeof(int));
		pthread_mutex_unlock(&fd->ref_lock);
		if (!c->refs_used)
		    return -1;
	    }
	}

	fd->last_slice = curr_rec - slice_rec;
	c->slice_rec = c->curr_rec;

	// Have we seen this reference before?
	if (bam_ref(b) >= 0 && bam_ref(b) != curr_ref && !fd->embed_ref &&
	    !fd->unsorted && multi_seq) {
	    
	    if (!c->refs_used) {
		pthread_mutex_lock(&fd->ref_lock);
		c->refs_used = calloc(fd->refs->nref, sizeof(int));
		pthread_mutex_unlock(&fd->ref_lock);
		if (!c->refs_used)
		    return -1;
	    } else if (c->refs_used && c->refs_used[bam_ref(b)]) {
		fprintf(stderr, "Unsorted mode enabled\n");
		pthread_mutex_lock(&fd->ref_lock);
		fd->unsorted = 1;
		pthread_mutex_unlock(&fd->ref_lock);
		fd->multi_seq = 1;
	    }
	}

	c->curr_ref = bam_ref(b);
	if (c->refs_used && c->curr_ref >= 0) c->refs_used[c->curr_ref]++;
    }

    if (!c->bams) {
	/* First time through, allocate a set of bam pointers */
	pthread_mutex_lock(&fd->bam_list_lock);
	if (fd->bl) {
	    spare_bams *spare = fd->bl;
	    c->bams = spare->bams;
	    fd->bl = spare->next;
	    free(spare);
	} else {
	    c->bams = calloc(c->max_c_rec, sizeof(bam_seq_t *));
	    if (!c->bams)
		return -1;
	}
	pthread_mutex_unlock(&fd->bam_list_lock);
    }

    /* Copy or alloc+copy the bam record, for later encoding */
    if (c->bams[c->curr_c_rec])
	bam_copy1(c->bams[c->curr_c_rec], b);
    else
	c->bams[c->curr_c_rec] = bam_dup(b);

    c->curr_rec++;
    c->curr_c_rec++;
    fd->record_counter++;

    return 0;
}